

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TransformFeedback::CaptureGeometryInterleaved::fetchLimits(CaptureGeometryInterleaved *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  undefined4 *puVar4;
  int local_1c;
  long lStack_18;
  GLint max_geometry_total_components;
  Functions *gl;
  CaptureGeometryInterleaved *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext
                     (*(Context **)
                       (&this->field_0x78 + (long)this->_vptr_CaptureGeometryInterleaved[-3]));
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lStack_18 + 0x868))
            (0x8c8a,&this->field_0x98 + (long)this->_vptr_CaptureGeometryInterleaved[-3]);
  dVar2 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xbb3);
  if (*(int *)(&this->field_0x98 + (long)this->_vptr_CaptureGeometryInterleaved[-3]) == 0) {
    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar4 = 0;
    __cxa_throw(puVar4,&int::typeinfo,0);
  }
  local_1c = 0;
  (**(code **)(lStack_18 + 0x868))(0x8de1,&local_1c);
  dVar2 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xbbe);
  if (local_1c == 0) {
    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar4 = 0;
    __cxa_throw(puVar4,&int::typeinfo,0);
  }
  if (local_1c < *(int *)(&this->field_0x98 + (long)this->_vptr_CaptureGeometryInterleaved[-3]) * 4)
  {
    *(int *)(&this->field_0x98 + (long)this->_vptr_CaptureGeometryInterleaved[-3]) = local_1c / 4;
  }
  return;
}

Assistant:

void gl3cts::TransformFeedback::CaptureGeometryInterleaved::fetchLimits(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetching limits. */
	gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS, &m_max_transform_feedback_components);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

	if (m_max_transform_feedback_components == 0)
	{
		throw 0;
	}

	glw::GLint max_geometry_total_components = 0;

	gl.getIntegerv(GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS, &max_geometry_total_components);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

	if (max_geometry_total_components == 0)
	{
		throw 0;
	}

	if (m_max_transform_feedback_components * 4 > max_geometry_total_components)
	{
		m_max_transform_feedback_components = max_geometry_total_components / 4;
	}
}